

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O2

void add_table(ecs_world_t *world,ecs_query_t *query,ecs_table_t *table)

{
  bool bVar1;
  trait_offset_t *trait_offsets;
  ecs_vector_t **ppeVar2;
  _Bool _Var3;
  uint uVar4;
  int32_t iVar5;
  uint uVar6;
  int32_t iVar7;
  ecs_query_t *peVar8;
  uint *puVar9;
  ecs_query_t *peVar10;
  int *piVar11;
  undefined8 *puVar12;
  ecs_ref_t *peVar13;
  long *plVar14;
  void *pvVar15;
  ecs_type_t peVar16;
  ecs_query_t *component;
  char *pcVar17;
  char *pcVar18;
  ulong uVar19;
  ecs_vector_t *vector;
  ulong uVar20;
  ecs_matched_table_t *peVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  uint uVar25;
  byte bVar26;
  ecs_type_t local_128;
  int local_11c;
  ecs_query_t *local_110;
  ecs_query_t *local_108;
  trait_offset_t *local_100;
  ulong local_f8;
  void *local_f0;
  undefined8 local_e8;
  int local_dc;
  int local_d8;
  int32_t local_d4;
  ecs_vector_t **local_d0;
  ecs_vector_t **local_c8;
  ulong local_c0;
  ecs_type_t local_b8;
  void *local_b0;
  ulong local_a8;
  ecs_matched_table_t local_a0;
  ecs_table_event_t local_50;
  
  bVar26 = 0;
  uVar4 = ecs_vector_count((query->sig).columns);
  if (table == (ecs_table_t *)0x0) {
    local_128 = (ecs_type_t)0x0;
  }
  else {
    local_128 = table->type;
  }
  local_d4 = count_traits(query,local_128);
  if (local_d4 == 0) {
    local_100 = (trait_offset_t *)0x0;
  }
  else {
    local_100 = (trait_offset_t *)(*ecs_os_api.calloc_)(uVar4 * 8);
  }
  local_dc = uVar4 * 8;
  local_d8 = uVar4 * 4;
  local_d0 = &query->empty_tables;
  local_c8 = &query->tables;
  local_a8 = 0;
  if (0 < (int)uVar4) {
    local_a8 = (ulong)uVar4;
  }
  local_f8 = 0;
  local_f0 = (void *)0x0;
  local_11c = 0;
  local_c0 = (ulong)uVar4;
  do {
    local_a0.monitor = (int32_t *)0x0;
    local_a0.rank = 0;
    local_a0._76_4_ = 0;
    local_a0.sparse_columns = (ecs_vector_t *)0x0;
    local_a0.bitset_columns = (ecs_vector_t *)0x0;
    local_a0.iter_data.types = (ecs_type_t *)0x0;
    local_a0.iter_data.references = (ecs_ref_t *)0x0;
    local_a0.iter_data.data = (ecs_data_t *)0x0;
    local_a0.iter_data.components = (ecs_entity_t *)0x0;
    local_a0.iter_data.columns = (int32_t *)0x0;
    if (table != (ecs_table_t *)0x0) {
      local_128 = table->type;
    }
    local_a0.iter_data.table = table;
    group_table(world,query,&local_a0);
    if ((int)local_c0 != 0) {
      local_a0.iter_data.columns = (int32_t *)(*ecs_os_api.malloc_)(local_d8);
      _ecs_assert((ecs_query_t *)local_a0.iter_data.columns != (ecs_query_t *)0x0,0x11,(char *)0x0,
                  "table_data.iter_data.columns != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x2ad);
      iVar22 = local_dc;
      if ((ecs_query_t *)local_a0.iter_data.columns == (ecs_query_t *)0x0) {
        __assert_fail("table_data.iter_data.columns != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x2ad,"void add_table(ecs_world_t *, ecs_query_t *, ecs_table_t *)");
      }
      local_a0.iter_data.components = (ecs_entity_t *)(*ecs_os_api.malloc_)(local_dc);
      _ecs_assert(local_a0.iter_data.components != (ecs_entity_t *)0x0,0x11,(char *)0x0,
                  "table_data.iter_data.components != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x2b2);
      if (local_a0.iter_data.components == (ecs_entity_t *)0x0) {
        __assert_fail("table_data.iter_data.components != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x2b2,"void add_table(ecs_world_t *, ecs_query_t *, ecs_table_t *)");
      }
      local_a0.iter_data.types = (ecs_type_t *)(*ecs_os_api.malloc_)(iVar22);
      _ecs_assert(local_a0.iter_data.types != (ecs_type_t *)0x0,0x11,(char *)0x0,
                  "table_data.iter_data.types != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x2b6);
      if (local_a0.iter_data.types == (ecs_type_t *)0x0) {
        __assert_fail("table_data.iter_data.types != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x2b6,"void add_table(ecs_world_t *, ecs_query_t *, ecs_table_t *)");
      }
    }
    local_b0 = _ecs_vector_first((query->sig).columns,0x28,0x10);
    local_11c = local_11c + 1;
    local_110 = (ecs_query_t *)0x0;
    for (uVar20 = 0; pvVar15 = local_b0, ppeVar2 = local_c8, uVar20 != local_a8; uVar20 = uVar20 + 1
        ) {
      lVar24 = uVar20 * 0x28;
      uVar4 = *(uint *)((long)local_b0 + lVar24 + 4);
      uVar25 = 5;
      if (uVar4 != 2) {
        uVar25 = *(uint *)((long)local_b0 + lVar24);
      }
      *(undefined4 *)((long)&((ecs_sig_t *)local_a0.iter_data.columns)->name + uVar20 * 4) = 0;
      local_108 = (ecs_query_t *)0x0;
      if (uVar4 == 2) {
        local_108 = *(ecs_query_t **)((long)local_b0 + lVar24 + 0x18);
      }
      peVar10 = local_108;
      if (uVar25 < 3) {
LAB_00119f81:
        if (uVar4 < 5) {
          peVar8 = (ecs_query_t *)
                   ((long)&switchD_00119f9a::switchdataD_0013bfa4 +
                   (long)(int)(&switchD_00119f9a::switchdataD_0013bfa4)[uVar4]);
          switch(uVar4) {
          default:
            component = *(ecs_query_t **)((long)local_b0 + lVar24 + 0x10);
            break;
          case 1:
            peVar8 = (ecs_query_t *)
                     ecs_type_contains(world,local_128,
                                       *(ecs_type_t *)((long)local_b0 + lVar24 + 0x10),false,true);
            component = peVar8;
            break;
          case 4:
            peVar8 = (ecs_query_t *)0xffffffffffffff;
            component = (ecs_query_t *)
                        (*(ulong *)((long)local_b0 + lVar24 + 0x10) & 0xffffffffffffff);
          }
        }
        else {
          peVar8 = (ecs_query_t *)local_a0.iter_data.columns;
          component = (ecs_query_t *)0x0;
        }
        if (uVar25 == 6) {
          peVar10 = *(ecs_query_t **)((long)pvVar15 + lVar24 + 0x18);
        }
LAB_0011a050:
        trait_offsets = local_100;
        local_e8 = CONCAT71((int7)((ulong)peVar8 >> 8),uVar25 != 5);
        if ((uVar25 != 5) && (peVar10 == (ecs_query_t *)0x0)) {
          iVar7 = (int32_t)uVar20;
          if (component == (ecs_query_t *)0x0) {
            component = (ecs_query_t *)0x0;
            peVar10 = (ecs_query_t *)0x0;
            iVar22 = 0;
          }
          else {
            if (((ulong)component & 0xff00000000000000) == 0xfa00000000000000) {
              peVar10 = (ecs_query_t *)((ulong)component & 0xffffffffffffff);
              if ((ulong)peVar10 >> 0x20 != 0) {
                if ((int)component == 0x11b) {
                  _ecs_assert(local_100 != (trait_offset_t *)0x0,0xc,(char *)0x0,
                              "trait_offsets != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                              ,0x19f);
                  if (trait_offsets == (trait_offset_t *)0x0) {
                    __assert_fail("trait_offsets != ((void*)0)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                  ,0x19f,
                                  "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                                 );
                  }
                  iVar5 = get_trait_index(local_128,(ulong)peVar10 >> 0x20,iVar7,trait_offsets,
                                          local_11c);
                  _ecs_assert(iVar5 != -1,0xc,(char *)0x0,"result != -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                              ,0x1ae);
                  if (iVar5 == -1) {
                    __assert_fail("result != -1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                  ,0x1ae,
                                  "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                                 );
                  }
                  puVar9 = (uint *)_ecs_vector_get(local_128,8,0x10,iVar5);
                  _ecs_assert(puVar9 != (uint *)0x0,0xc,(char *)0x0,"trait != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                              ,0x1b3);
                  if (puVar9 == (uint *)0x0) {
                    __assert_fail("trait != ((void*)0)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                  ,0x1b3,
                                  "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                                 );
                  }
                  component = (ecs_query_t *)(ulong)*puVar9;
                }
                goto LAB_0011a2e1;
              }
              _ecs_assert(local_100 != (trait_offset_t *)0x0,0xc,(char *)0x0,"trait_offsets != NULL"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x17f);
              if (trait_offsets == (trait_offset_t *)0x0) {
                __assert_fail("trait_offsets != ((void*)0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                              ,0x17f,
                              "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                             );
              }
              iVar5 = get_trait_index(local_128,(ecs_entity_t)peVar10,iVar7,trait_offsets,local_11c)
              ;
              if (iVar5 == -1) {
                iVar22 = -1;
              }
              else {
                puVar9 = (uint *)_ecs_vector_get(local_128,8,0x10,iVar5);
                component = *(ecs_query_t **)puVar9;
                pvVar15 = ecs_get_w_entity(world,(ecs_entity_t)peVar10,1);
                if (pvVar15 == (void *)0x0) {
                  peVar10 = (ecs_query_t *)(ulong)*puVar9;
                }
                iVar22 = iVar5 + 1;
              }
            }
            else {
              if (((ulong)component & 0xff00000000000000) == 0xfc00000000000000) {
                iVar5 = ecs_table_switch_from_case(world,table,(ecs_entity_t)component);
                _ecs_assert(iVar5 != -1,0xc,(char *)0x0,"result != -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                            ,0x175);
                if (iVar5 == -1) {
                  __assert_fail("result != -1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                ,0x175,
                                "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                               );
                }
                iVar5 = iVar5 + table->sw_column_offset;
                peVar10 = component;
              }
              else {
LAB_0011a2e1:
                iVar5 = ecs_type_index_of(local_128,(ecs_entity_t)component);
                peVar10 = component;
              }
              iVar22 = iVar5 + 1;
              component = peVar10;
              if (iVar22 == 0) {
                iVar22 = -1;
              }
            }
            if ((((ulong)peVar10 & 0xff00000000000000) != 0xfb00000000000000) &&
               (((ulong)peVar10 & 0xff00000000000000) != 0xfc00000000000000)) {
              peVar10 = (ecs_query_t *)ecs_get_typeid(world,(ecs_entity_t)peVar10);
              piVar11 = (int *)ecs_get_w_entity(world,(ecs_entity_t)peVar10,1);
              if ((piVar11 == (int *)0x0) || (*piVar11 == 0)) {
                iVar22 = 0;
              }
            }
          }
          iVar23 = 0;
          if ((uVar4 == 4) ||
             (((uVar4 == 3 &&
               (_Var3 = ecs_type_has_entity(world,local_128,(ecs_entity_t)peVar10), !_Var3)) ||
              (iVar23 = iVar22, iVar22 != -1)))) {
            if (uVar4 == 3 && uVar25 == 2) {
              iVar23 = 0;
            }
          }
          else {
            iVar23 = -(uint)(uVar4 != 3 || uVar25 != 1);
          }
          *(int *)((long)&((ecs_sig_t *)local_a0.iter_data.columns)->name + uVar20 * 4) = iVar23;
          if (((ulong)component & 0xff00000000000000) == 0xfc00000000000000) {
            puVar12 = (undefined8 *)_ecs_vector_add(&local_a0.sparse_columns,0x18,0x10);
            *(int32_t *)(puVar12 + 2) = iVar7;
            puVar12[1] = (ulong)component & 0xffffffffffffff;
            *puVar12 = 0;
          }
          if ((iVar23 == 0) || ((table->flags & 0x20000) == 0)) goto LAB_0011a427;
          iVar7 = ecs_type_index_of(table->type,
                                    (ulong)component & 0xffffffffffffff | 0xf400000000000000);
          if (iVar7 != -1) {
            puVar12 = (undefined8 *)_ecs_vector_add(&local_a0.bitset_columns,0x10,0x10);
            *(int32_t *)(puVar12 + 1) = iVar7;
            *puVar12 = 0;
            local_e8 = CONCAT71((int7)((ulong)puVar12 >> 8),1);
          }
          peVar10 = (ecs_query_t *)0x0;
        }
        else if (peVar10 != (ecs_query_t *)0x0) goto LAB_0011a10f;
LAB_0011a481:
        bVar1 = true;
        if ((uVar25 == 7) ||
           (*(int *)((long)&((ecs_sig_t *)local_a0.iter_data.columns)->name + uVar20 * 4) == -1))
        goto LAB_0011a4a4;
      }
      else {
        if (uVar25 != 5) {
          if (uVar25 == 6) goto LAB_00119f81;
          if ((uVar25 & 0xfffffffb) == 3) {
            if (uVar4 != 3) {
              if (uVar4 == 1) {
                component = (ecs_query_t *)
                            components_contains(world,local_128,
                                                *(ecs_type_t *)((long)local_b0 + lVar24 + 0x10),
                                                (ecs_entity_t *)&local_108,false);
                peVar8 = component;
                peVar10 = local_108;
                goto LAB_0011a050;
              }
              if (uVar4 != 0) goto LAB_0011a1fc;
            }
            component = *(ecs_query_t **)((long)local_b0 + lVar24 + 0x10);
            peVar8 = (ecs_query_t *)
                     ecs_find_in_type(world,local_128,(ecs_entity_t)component,0xfd00000000000000);
            peVar10 = peVar8;
          }
          else if (uVar25 == 4) {
            if (uVar4 == 0) {
              component = *(ecs_query_t **)((long)local_b0 + lVar24 + 0x10);
            }
            else {
              component = (ecs_query_t *)0x0;
            }
            peVar10 = (ecs_query_t *)query->system;
            peVar8 = query;
          }
          else {
LAB_0011a1fc:
            component = (ecs_query_t *)0x0;
            peVar8 = (ecs_query_t *)(ulong)(uVar25 & 0xfffffffb);
          }
          goto LAB_0011a050;
        }
        component = *(ecs_query_t **)((long)local_b0 + lVar24 + 0x10);
        local_e8 = 0;
        if (local_108 == (ecs_query_t *)0x0) {
LAB_0011a427:
          peVar10 = (ecs_query_t *)0x0;
          goto LAB_0011a481;
        }
LAB_0011a10f:
        bVar1 = false;
LAB_0011a4a4:
        local_108 = local_110;
        piVar11 = (int *)ecs_get_w_entity(world,(ecs_entity_t)component,1);
        peVar13 = (ecs_ref_t *)_ecs_vector_add((ecs_vector_t **)&local_108,0x30,0x10);
        if (uVar25 - 5 < 2) {
LAB_0011a5f4:
          _ecs_assert(peVar10 != (ecs_query_t *)0x0,0xc,(char *)0x0,"e != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x209);
          if (peVar10 == (ecs_query_t *)0x0) {
            __assert_fail("e != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x209,
                          "ecs_vector_t *add_ref(ecs_world_t *, ecs_query_t *, ecs_type_t, ecs_vector_t *, ecs_entity_t, ecs_entity_t, ecs_sig_from_kind_t)"
                         );
          }
        }
        else {
          if ((uVar25 != 4) && (uVar25 != 7)) {
            vector = local_128;
            if (!bVar1) {
              plVar14 = (long *)_ecs_sparse_get_sparse
                                          ((world->store).entity_index,0x10,(uint64_t)peVar10);
              _ecs_assert(plVar14 != (long *)0x0,0xc,(char *)0x0,"record != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x38);
              if (plVar14 == (long *)0x0) {
                __assert_fail("record != ((void*)0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                              ,0x38,
                              "ecs_entity_t get_entity_for_component(ecs_world_t *, ecs_entity_t, ecs_type_t, ecs_entity_t)"
                             );
              }
              if ((undefined8 *)*plVar14 == (undefined8 *)0x0) {
                vector = (ecs_vector_t *)0x0;
              }
              else {
                vector = *(ecs_vector_t **)*plVar14;
              }
            }
            uVar6 = ecs_vector_count(vector);
            local_b8 = vector;
            pvVar15 = _ecs_vector_first(vector,8,0x10);
            if ((int)uVar6 < 1) {
              uVar6 = 0;
            }
            uVar19 = 0;
            do {
              if (uVar6 == uVar19) {
                peVar10 = (ecs_query_t *)
                          ecs_find_entity_in_prefabs
                                    (world,(ecs_entity_t)peVar10,local_b8,(ecs_entity_t)component,0)
                ;
                break;
              }
              lVar24 = uVar19 * 8;
              uVar19 = uVar19 + 1;
            } while (*(ecs_query_t **)((long)pvVar15 + lVar24) != component);
          }
          if (uVar25 != 7) goto LAB_0011a5f4;
        }
        peVar13->record = (ecs_record_t *)0x0;
        peVar13->ptr = (void *)0x0;
        peVar13->table = (void *)0x0;
        peVar13->row = 0;
        peVar13->alloc_count = 0;
        peVar13->entity = (ecs_entity_t)peVar10;
        peVar13->component = (ecs_entity_t)component;
        _Var3 = ecs_has_type(world,(ecs_entity_t)component,FLECS__TEcsComponent);
        if ((_Var3) && ((char)local_e8 == '\x01' && *piVar11 != 0)) {
          if (peVar10 != (ecs_query_t *)0x0) {
            ecs_get_ref_w_entity(world,peVar13,(ecs_entity_t)peVar10,(ecs_entity_t)component);
            ecs_set_watch(world,(ecs_entity_t)peVar10);
          }
          *(byte *)&query->flags = (byte)query->flags | 0x40;
        }
        local_110 = local_108;
        iVar7 = ecs_vector_count((ecs_vector_t *)local_108);
        *(int32_t *)((long)&((ecs_sig_t *)local_a0.iter_data.columns)->name + uVar20 * 4) = -iVar7;
      }
      local_a0.iter_data.components[uVar20] = (ecs_entity_t)component;
      if (uVar4 == 4) {
        pvVar15 = ecs_get_w_entity(world,(ecs_entity_t)component,3);
        _ecs_assert(pvVar15 != (void *)0x0,2,(char *)0x0,"type != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                    ,0x277);
        if (pvVar15 == (void *)0x0) {
          __assert_fail("type != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                        ,0x277,
                        "ecs_type_t get_column_type(ecs_world_t *, ecs_sig_oper_kind_t, ecs_entity_t)"
                       );
        }
        peVar16 = *(ecs_type_t *)((long)pvVar15 + 8);
      }
      else {
        peVar16 = ecs_type_from_entity(world,(ecs_entity_t)component);
      }
      local_a0.iter_data.types[uVar20] = peVar16;
    }
    if ((table == (ecs_table_t *)0x0) || ((query->flags & 0xe) != 0)) {
      puVar12 = (undefined8 *)_ecs_vector_add(local_c8,0x50,0x10);
      iVar7 = ecs_vector_count(*ppeVar2);
      _ecs_assert(0 < iVar7,0xc,(char *)0x0,"matched_table_index >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x335);
      if (iVar7 < 1) {
        __assert_fail("matched_table_index >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x335,"void add_table(ecs_world_t *, ecs_query_t *, ecs_table_t *)");
      }
      iVar7 = iVar7 + -1;
    }
    else {
      puVar12 = (undefined8 *)_ecs_vector_add(local_d0,0x50,0x10);
      iVar7 = ecs_vector_count(query->empty_tables);
      iVar22 = (int)local_f8;
      local_f0 = (*ecs_os_api.realloc_)(local_f0,iVar22 * 4 + 4);
      *(int32_t *)((long)local_f0 + (long)iVar22 * 4) = -iVar7;
      pcVar17 = ecs_type_str(world,table->type);
      pcVar18 = query_name(world,query);
      _ecs_trace(2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                 ,0x327,"query #[green]%s#[reset] matched with table #[green][%s]",pcVar18,pcVar17);
      (*ecs_os_api.free_)(pcVar17);
      local_f8 = (ulong)(iVar22 + 1);
    }
    if (local_110 != (ecs_query_t *)0x0) {
      iVar5 = ecs_vector_count((ecs_vector_t *)local_110);
      peVar13 = (ecs_ref_t *)(*ecs_os_api.malloc_)(iVar5 * 0x30);
      local_a0.iter_data.references = peVar13;
      pvVar15 = _ecs_vector_first((ecs_vector_t *)local_110,0x30,0x10);
      memcpy(peVar13,pvVar15,(long)(iVar5 * 0x30));
      ecs_vector_free((ecs_vector_t *)local_110);
    }
    pvVar15 = local_f0;
    peVar21 = &local_a0;
    for (lVar24 = 10; lVar24 != 0; lVar24 = lVar24 + -1) {
      *puVar12 = (peVar21->iter_data).columns;
      peVar21 = (ecs_matched_table_t *)((long)peVar21 + ((ulong)bVar26 * -2 + 1) * 8);
      puVar12 = puVar12 + (ulong)bVar26 * -2 + 1;
    }
  } while (local_11c < local_d4);
  if (local_f0 == (void *)0x0) {
    if (table == (ecs_table_t *)0x0) goto LAB_0011a9bf;
  }
  else {
    puVar12 = (undefined8 *)_ecs_map_ensure(query->table_indices,0x10,(ulong)table->id);
    if ((void *)*puVar12 != (void *)0x0) {
      (*ecs_os_api.free_)((void *)*puVar12);
    }
    *puVar12 = pvVar15;
    *(int *)(puVar12 + 1) = (int)local_f8;
  }
  if ((query->flags & 0x100) == 0) {
    local_50.kind = EcsTableQueryMatch;
    local_50.component = 0;
    local_50.query = query;
    local_50.matched_table_index = iVar7;
    ecs_table_notify(world,table,&local_50);
  }
  else {
    iVar7 = ecs_table_count(table);
    if (iVar7 != 0) {
      activate_table(world,query,table,true);
    }
  }
LAB_0011a9bf:
  if (local_100 != (trait_offset_t *)0x0) {
    (*ecs_os_api.free_)(local_100);
  }
  return;
}

Assistant:

static
void add_table(
    ecs_world_t *world,
    ecs_query_t *query,
    ecs_table_t *table)
{
    ecs_type_t table_type = NULL;
    int32_t c, column_count = ecs_vector_count(query->sig.columns);

    if (table) {
        table_type = table->type;
    }

    int32_t trait_cur = 0, trait_count = count_traits(query, table_type);
    
    /* If the query has traits, we need to account for the fact that a table may
     * have multiple components to which the trait is applied, which means the
     * table has to be registered with the query multiple times, with different
     * table columns. If so, allocate a small array for each trait in which the
     * last added table index of the trait is stored, so that in the next 
     * iteration we can start the search from the correct offset type. */
    trait_offset_t *trait_offsets = NULL;
    if (trait_count) {
        trait_offsets = ecs_os_calloc(
            ECS_SIZEOF(trait_offset_t) * column_count);
    }

    /* From here we recurse */
    int32_t *table_indices = NULL;
    int32_t table_indices_count = 0;
    int32_t matched_table_index = 0;
    ecs_matched_table_t table_data;
    ecs_vector_t *references = NULL;

add_trait:
    table_data = (ecs_matched_table_t){ .iter_data.table = table };
    if (table) {
        table_type = table->type;
    }

    /* If grouping is enabled for query, assign the group rank to the table */
    group_table(world, query, &table_data);

    if (column_count) {
        /* Array that contains the system column to table column mapping */
        table_data.iter_data.columns = ecs_os_malloc(ECS_SIZEOF(int32_t) * column_count);
        ecs_assert(table_data.iter_data.columns != NULL, ECS_OUT_OF_MEMORY, NULL);

        /* Store the components of the matched table. In the case of OR expressions,
        * components may differ per matched table. */
        table_data.iter_data.components = ecs_os_malloc(ECS_SIZEOF(ecs_entity_t) * column_count);
        ecs_assert(table_data.iter_data.components != NULL, ECS_OUT_OF_MEMORY, NULL);

        /* Also cache types, so no lookup is needed while iterating */
        table_data.iter_data.types = ecs_os_malloc(ECS_SIZEOF(ecs_type_t) * column_count);
        ecs_assert(table_data.iter_data.types != NULL, ECS_OUT_OF_MEMORY, NULL);        
    }

    /* Walk columns parsed from the system signature */
    ecs_sig_column_t *columns = ecs_vector_first(
        query->sig.columns, ecs_sig_column_t);

    for (c = 0; c < column_count; c ++) {
        ecs_sig_column_t *column = &columns[c];
        ecs_entity_t entity = 0, component = 0;
        ecs_sig_oper_kind_t op = column->oper_kind;
        ecs_sig_from_kind_t from = column->from_kind;

        if (op == EcsOperNot) {
            from = EcsFromEmpty;
        }

        table_data.iter_data.columns[c] = 0;

        /* Get actual component and component source for current column */
        get_comp_and_src(world, query, table_type, column, op, from, &component, 
            &entity);

        /* This column does not retrieve data from a static entity (either
         * EcsFromSystem or EcsFromParent) and is not just a handle */
        if (!entity && from != EcsFromEmpty) {
            int32_t index = get_component_index(world, table, table_type, 
                &component, c, op, trait_offsets, trait_cur + 1);

            if (index == -1) {
                if (from == EcsFromOwned && op == EcsOperOptional) {
                    index = 0;
                }
            } else {
                if (from == EcsFromShared && op == EcsOperOptional) {
                    index = 0;
                }
            }

            table_data.iter_data.columns[c] = index;

            /* If the column is a case, we should only iterate the entities in
             * the column for this specific case. Add a sparse column with the
             * case id so we can find the correct entities when iterating */
            if (ECS_HAS_ROLE(component, CASE)) {
                ecs_sparse_column_t *sc = ecs_vector_add(
                    &table_data.sparse_columns, ecs_sparse_column_t);
                sc->signature_column_index = c;
                sc->sw_case = component & ECS_COMPONENT_MASK;
                sc->sw_column = NULL;
            }

            /* If table has a disabled bitmask for components, check if there is
             * a disabled column for the queried for component. If so, cache it
             * in a vector as the iterator will need to skip the entity when the
             * component is disabled. */
            if (index && (table->flags & EcsTableHasDisabled)) {
                ecs_entity_t bs_id = 
                    (component & ECS_COMPONENT_MASK) | ECS_DISABLED;
                int32_t bs_index = ecs_type_index_of(table->type, bs_id);
                if (bs_index != -1) {
                    ecs_bitset_column_t *elem = ecs_vector_add(
                        &table_data.bitset_columns, ecs_bitset_column_t);
                    elem->column_index = bs_index;
                    elem->bs_column = NULL;
                }
            }
        }

        /* Check if a the component is a reference. If 'entity' is set, the
         * component must be resolved from another entity, which is the case
         * for FromEntity and FromContainer. 
         * 
         * If no entity is set but the component is not found in the table, it
         * must come from a prefab. This is guaranteed, as at this point it is
         * already validated that the table matches with the system.
         * 
         * If the column from is Cascade, there may not be an entity in case the
         * current table contains root entities. In that case, still add a
         * reference field. The application can, after the table has matched,
         * change the set of components, so that this column will turn into a
         * reference. Having the reference already linked to the system table
         * makes changing this administation easier when the change happens.
         */
        if ((entity || table_data.iter_data.columns[c] == -1 || from == EcsCascade)) {
            references = add_ref(world, query, table_type, references, 
                component, entity, from);
            table_data.iter_data.columns[c] = -ecs_vector_count(references);
        }

        table_data.iter_data.components[c] = component;
        table_data.iter_data.types[c] = get_column_type(world, op, component);
    }

    /* Initially always add table to inactive group. If the system is registered
     * with the table and the table is not empty, the table will send an
     * activate signal to the system. */

    ecs_matched_table_t *table_elem;
    if (table && has_auto_activation(query)) {
        table_elem = ecs_vector_add(&query->empty_tables, 
            ecs_matched_table_t);

        /* Store table index */
        matched_table_index = ecs_vector_count(query->empty_tables);
        table_indices_count ++;
        table_indices = ecs_os_realloc(
            table_indices, table_indices_count * ECS_SIZEOF(int32_t));
        table_indices[table_indices_count - 1] = -matched_table_index;

        #ifndef NDEBUG
        char *type_expr = ecs_type_str(world, table->type);
        ecs_trace_2("query #[green]%s#[reset] matched with table #[green][%s]",
            query_name(world, query), type_expr);
        ecs_os_free(type_expr);
        #endif
    } else {
        /* If no table is provided to function, this is a system that contains
         * no columns that require table matching. In this case, the system will
         * only have one "dummy" table that caches data from the system columns.
         * Always add this dummy table to the list of active tables, since it
         * would never get activated otherwise. */
        table_elem = ecs_vector_add(&query->tables, ecs_matched_table_t);

        /* If query doesn't automatically activates/inactivates tables, we can 
         * get the count to determine the current table index. */
        matched_table_index = ecs_vector_count(query->tables) - 1;
        ecs_assert(matched_table_index >= 0, ECS_INTERNAL_ERROR, NULL);
    }

    if (references) {
        ecs_size_t ref_size = ECS_SIZEOF(ecs_ref_t) * ecs_vector_count(references);
        table_data.iter_data.references = ecs_os_malloc(ref_size);
        ecs_os_memcpy(table_data.iter_data.references, 
            ecs_vector_first(references, ecs_ref_t), ref_size);
        ecs_vector_free(references);
        references = NULL;
    }

    *table_elem = table_data;

    /* Use tail recursion when adding table for multiple traits */
    trait_cur ++;
    if (trait_cur < trait_count) {
        goto add_trait;
    }

    /* Register table indices before sending out the match signal. This signal
     * can cause table activation, and table indices are needed for that. */
    if (table_indices) {
        ecs_table_indices_t *ti = ecs_map_ensure(
            query->table_indices, ecs_table_indices_t, table->id);
        if (ti->indices) {
            ecs_os_free(ti->indices);
        }
        ti->indices = table_indices;
        ti->count = table_indices_count;
    }

    if (table && !(query->flags & EcsQueryIsSubquery)) {
        ecs_table_notify(world, table, &(ecs_table_event_t){
            .kind = EcsTableQueryMatch,
            .query = query,
            .matched_table_index = matched_table_index
        });
    } else if (table && ecs_table_count(table)) {
        activate_table(world, query, table, true);
    }

    if (trait_offsets) {
        ecs_os_free(trait_offsets);
    }
}